

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O2

ConstantValue * __thiscall
slang::ast::Bitstream::evaluateCast
          (ConstantValue *__return_storage_ptr__,Bitstream *this,Type *type,ConstantValue *value,
          SourceRange sourceRange,EvalContext *context,bool isImplicit)

{
  SourceRange range;
  SourceRange range_00;
  bool bVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  Diagnostic *pDVar4;
  ulong uVar5;
  uint64_t dynamicSize;
  SourceLocation local_a8;
  SourceLocation local_a0;
  SourceLocation local_98;
  uint64_t bitOffset;
  ulong local_88;
  bool local_80;
  SmallVector<slang::ConstantValue_*,_5UL> packed;
  const_iterator iter;
  
  local_a8 = sourceRange.endLoc;
  local_98 = sourceRange.startLoc;
  local_a0 = (SourceLocation)value;
  uVar2 = ConstantValue::getBitstreamWidth((ConstantValue *)type);
  dynamicSize = 0;
  if ((char)context == '\0') {
    bVar1 = Type::isFixedSize((Type *)this);
    if (bVar1) {
      uVar3 = Type::getBitstreamWidth((Type *)this);
      uVar5 = -(ulong)(uVar3 != uVar2);
    }
    else {
      dynamicBitstreamSize((DynamicSize *)&packed,(Type *)this,DestEmpty);
      uVar5 = 0xffffffffffffffff;
      if (((char)packed.super_SmallVectorBase<slang::ConstantValue_*>.cap == '\x01') &&
         (packed.super_SmallVectorBase<slang::ConstantValue_*>.len <= uVar2)) {
        if (uVar2 - packed.super_SmallVectorBase<slang::ConstantValue_*>.len == 0) {
          uVar5 = 0;
        }
        else {
          dynamicBitstreamSize((DynamicSize *)&bitOffset,(Type *)this,DestFill);
          if ((local_80 != true) ||
             (((uVar5 = uVar2 - local_88, uVar2 < local_88 ||
               ((bitOffset != 0 && (uVar5 % bitOffset != 0)))) &&
              ((packed.super_SmallVectorBase<slang::ConstantValue_*>.data_ == (pointer)0x0 ||
               (uVar5 = 0,
               (uVar2 - packed.super_SmallVectorBase<slang::ConstantValue_*>.len) %
               (ulong)packed.super_SmallVectorBase<slang::ConstantValue_*>.data_ != 0)))))) {
            uVar5 = 0xffffffffffffffff;
          }
        }
      }
    }
    if (uVar2 < uVar5) {
      range_00.endLoc = local_98;
      range_00.startLoc = local_a0;
      dynamicSize = uVar5;
      pDVar4 = EvalContext::addDiag((EvalContext *)local_a8,(DiagCode)0x2000c,range_00);
      uVar2 = ConstantValue::getBitstreamWidth((ConstantValue *)type);
      pDVar4 = Diagnostic::operator<<<unsigned_long>(pDVar4,uVar2);
      ast::operator<<(pDVar4,(Type *)this);
      goto LAB_00373c72;
    }
  }
  else {
    uVar3 = Type::getBitstreamWidth((Type *)this);
    uVar5 = dynamicSize;
    if ((uVar3 <= uVar2 && uVar2 - uVar3 != 0) &&
       (bVar1 = Type::isFixedSize((Type *)this), uVar5 = uVar2 - uVar3, bVar1)) {
      range.endLoc = local_98;
      range.startLoc = local_a0;
      pDVar4 = EvalContext::addDiag((EvalContext *)local_a8,(DiagCode)0x2c0007,range);
      pDVar4 = Diagnostic::operator<<<unsigned_long>(pDVar4,uVar3);
      Diagnostic::operator<<<unsigned_long>(pDVar4,uVar2);
LAB_00373c72:
      *(__index_type *)
       ((long)&(__return_storage_ptr__->value).
               super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
       + 0x20) = '\0';
      return __return_storage_ptr__;
    }
  }
  dynamicSize = uVar5;
  packed.super_SmallVectorBase<slang::ConstantValue_*>.data_ =
       (pointer)packed.super_SmallVectorBase<slang::ConstantValue_*>.firstElement;
  packed.super_SmallVectorBase<slang::ConstantValue_*>.len = 0;
  packed.super_SmallVectorBase<slang::ConstantValue_*>.cap = 5;
  packBitstream((ConstantValue *)type,&packed.super_SmallVectorBase<slang::ConstantValue_*>);
  bitOffset = 0;
  iter = packed.super_SmallVectorBase<slang::ConstantValue_*>.data_;
  unpackBitstream(__return_storage_ptr__,(Type *)this,&iter,
                  packed.super_SmallVectorBase<slang::ConstantValue_*>.data_ +
                  packed.super_SmallVectorBase<slang::ConstantValue_*>.len,&bitOffset,&dynamicSize);
  SmallVectorBase<slang::ConstantValue_*>::cleanup
            (&packed.super_SmallVectorBase<slang::ConstantValue_*>,(EVP_PKEY_CTX *)this);
  return __return_storage_ptr__;
}

Assistant:

ConstantValue Bitstream::evaluateCast(const Type& type, ConstantValue&& value,
                                      SourceRange sourceRange, EvalContext& context,
                                      bool isImplicit) {
    auto srcSize = value.getBitstreamWidth();
    uint64_t dynamicSize = 0;
    if (!isImplicit) { // Explicit bit-stream casting
        dynamicSize = bitstreamCastRemainingSize(type, srcSize);
        if (dynamicSize > srcSize) {
            context.addDiag(diag::ConstEvalBitstreamCastSize, sourceRange)
                << value.getBitstreamWidth() << type;
            return nullptr;
        }
    }
    else { // implicit streaming concatenation conversion
        auto targetWidth = type.getBitstreamWidth();
        if (targetWidth < srcSize) {
            if (type.isFixedSize()) {
                context.addDiag(diag::BadStreamSize, sourceRange) << targetWidth << srcSize;
                return nullptr;
            }
            dynamicSize = srcSize - targetWidth;
        }
    }

    SmallVector<ConstantValue*> packed;
    packBitstream(value, packed);

    uint64_t bitOffset = 0;
    auto iter = std::cbegin(packed);
    auto cv = unpackBitstream(type, iter, std::cend(packed), bitOffset, dynamicSize);
    SLANG_ASSERT(!dynamicSize);
    SLANG_ASSERT(isImplicit || (iter == std::cend(packed) && !bitOffset));
    return cv;
}